

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O0

void __thiscall itis::SplayTree::prettyPrint(SplayTree *this,Node *vertex)

{
  ostream *poVar1;
  Node *vertex_local;
  SplayTree *this_local;
  
  if (vertex == (Node *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"empty tree");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if ((vertex->left_child == (Node *)0x0) || (vertex->right_child == (Node *)0x0)) {
    if (vertex->left_child == (Node *)0x0) {
      if (vertex->right_child == (Node *)0x0) {
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vertex->data);
        poVar1 = std::operator<<(poVar1,": no children");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vertex->data);
        poVar1 = std::operator<<(poVar1,": ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,vertex->right_child->data);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vertex->data);
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,vertex->left_child->data);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vertex->data);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,vertex->left_child->data);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,vertex->right_child->data);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((vertex->left_child == (Node *)0x0) || (vertex->right_child == (Node *)0x0)) {
    if (vertex->left_child == (Node *)0x0) {
      if (vertex->right_child != (Node *)0x0) {
        prettyPrint(this,vertex->right_child);
      }
    }
    else {
      prettyPrint(this,vertex->left_child);
    }
  }
  else {
    prettyPrint(this,vertex->left_child);
    prettyPrint(this,vertex->right_child);
  }
  return;
}

Assistant:

void SplayTree::prettyPrint(Node *vertex) {
    if (vertex == nullptr){
      std::cout << "empty tree" << std::endl;
    } else if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << ", " << vertex->right_child->data << std::endl;
    } else if (vertex->left_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->left_child->data << std::endl;
    } else if (vertex->right_child != nullptr) {
      std::cout << vertex->data << ": " << vertex->right_child->data << std::endl;
    } else {
      std::cout << vertex->data << ": no children" << std::endl;
    }
    if (vertex->left_child != nullptr && vertex->right_child != nullptr) {
      prettyPrint(vertex->left_child);
      prettyPrint(vertex->right_child);
    } else if (vertex->left_child != nullptr) {
      prettyPrint(vertex->left_child);
    } else if (vertex->right_child != nullptr) {
      prettyPrint(vertex->right_child);
    }
  }